

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

QHash<QByteArray,_QByteArray> parseHttpOptionHeader(QByteArrayView header)

{
  byte bVar1;
  bool bVar2;
  storage_type *psVar3;
  uint uVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  ulong uVar7;
  void *pvVar8;
  bool bVar9;
  storage_type *in_RDX;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong in_RSI;
  long lVar14;
  Data *in_RDI;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  QByteArrayView QVar18;
  QByteArray local_98;
  QByteArray local_80;
  QByteArray local_68;
  QByteArrayView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0;
  uVar7 = 0;
  bVar9 = false;
  local_48.m_size = in_RSI;
  local_48.m_data = in_RDX;
  do {
    uVar10 = (ulong)(int)uVar7;
    uVar7 = local_48.m_size;
    if ((long)uVar10 < local_48.m_size) {
      do {
        uVar7 = uVar10;
        if ((0x20 < (ulong)(byte)local_48.m_data[uVar10]) ||
           ((0x100002600U >> ((ulong)(byte)local_48.m_data[uVar10] & 0x3f) & 1) == 0)) break;
        uVar10 = uVar10 + 1;
        uVar7 = local_48.m_size;
      } while (local_48.m_size != uVar10);
    }
    uVar11 = (uint)uVar7;
    uVar10 = (ulong)(int)uVar11;
    if (local_48.m_size == uVar10) goto LAB_002183e3;
    qVar5 = QByteArrayView::indexOf(&local_48,',',uVar10);
    qVar6 = QByteArrayView::indexOf(&local_48,'=',uVar10);
    psVar3 = local_48.m_data;
    uVar15 = (uint)qVar5;
    uVar16 = (uint)qVar6;
    if (uVar11 == uVar16 || uVar11 == uVar15) {
      bVar2 = false;
      bVar9 = true;
    }
    else {
      uVar4 = uVar15;
      if (uVar15 == 0xffffffff) {
        uVar4 = (uint)local_48.m_size;
      }
      uVar12 = uVar16;
      if ((int)uVar4 < (int)uVar16) {
        uVar12 = uVar4;
      }
      if (uVar16 == 0xffffffff) {
        uVar12 = uVar4;
      }
      QVar18.m_size = (long)(int)(uVar12 - uVar11);
      QVar18.m_data = local_48.m_data + uVar10;
      auVar17 = QtPrivate::trimmed(QVar18);
      uVar7 = (ulong)(uVar12 + 1);
      if (uVar16 < uVar15) {
        uVar10 = (ulong)(int)(uVar12 + 1);
        uVar7 = local_48.m_size;
        if ((long)uVar10 < local_48.m_size) {
          do {
            uVar7 = uVar10;
            if ((0x20 < (ulong)(byte)psVar3[uVar10]) ||
               ((0x100002600U >> ((ulong)(byte)psVar3[uVar10] & 0x3f) & 1) == 0)) break;
            uVar10 = uVar10 + 1;
            uVar7 = local_48.m_size;
          } while (local_48.m_size != uVar10);
        }
        iVar13 = (int)uVar7;
        lVar14 = local_48.m_size - iVar13;
        if (lVar14 == 0) {
          bVar2 = false;
          bVar9 = true;
        }
        else {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char *)0x0;
          local_68.d.size = 0;
          if (lVar14 < 1) {
            lVar14 = 0;
          }
          QByteArray::reallocData((longlong)&local_68,(AllocationOption)lVar14);
          if ((&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) &&
             (*(qsizetype *)((long)local_68.d.d + 8) != 0)) {
            *(byte *)&(((ArrayOptions *)((long)local_68.d.d + 4))->
                      super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                      super_QFlagsStorage<QArrayData::ArrayOption>.i =
                 (byte)(((ArrayOptions *)((long)local_68.d.d + 4))->
                       super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                       super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
          }
          if (local_48.m_data[iVar13] == '\"') {
            uVar7 = (ulong)(iVar13 + 1);
            do {
              iVar13 = (int)uVar7;
              lVar14 = (long)iVar13;
              if (local_48.m_size <= lVar14) goto LAB_002182a3;
              if (local_48.m_data[lVar14] == '\"') {
                bVar2 = false;
                iVar13 = 5;
              }
              else {
                if (local_48.m_data[lVar14] == '\\') {
                  uVar7 = lVar14 + 1;
                  if (local_48.m_size <= (long)uVar7) {
                    bVar9 = true;
                    iVar13 = 1;
                    bVar2 = false;
                    uVar7 = uVar7 & 0xffffffff;
                    goto LAB_00218296;
                  }
                  iVar13 = (int)uVar7;
                }
                QByteArray::append((char)&local_68);
                uVar7 = (ulong)(iVar13 + 1);
                iVar13 = 0;
                bVar2 = true;
              }
LAB_00218296:
            } while (iVar13 == 0);
            if (iVar13 == 5) goto LAB_002182a3;
          }
          else {
            do {
              iVar13 = (int)uVar7;
              if (local_48.m_size <= iVar13) break;
              bVar1 = local_48.m_data[iVar13];
              if ((((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                 (pvVar8 = memchr(parseHttpOptionHeader(QByteArrayView)::$_0::operator()(char)::
                                  separators,(int)(char)bVar1,0x12), pvVar8 != (void *)0x0)) {
                bVar2 = false;
              }
              else {
                QByteArray::append((char)&local_68);
                uVar7 = (ulong)(iVar13 + 1);
                bVar2 = true;
              }
            } while (bVar2);
LAB_002182a3:
            QByteArray::QByteArray(&local_98,auVar17._8_8_,auVar17._0_8_);
            QByteArray::toLower_helper(&local_80);
            QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                      ((QHash<QByteArray,QByteArray> *)in_RDI,&local_80,&local_68);
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
              }
            }
            qVar5 = QByteArrayView::indexOf(&local_48,',',(long)(int)uVar7);
            if ((int)qVar5 == -1) {
              bVar9 = true;
              bVar2 = false;
            }
            else {
              bVar2 = true;
              uVar7 = (ulong)((int)qVar5 + 1);
            }
          }
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
      }
      else {
        QByteArray::QByteArray(&local_80,auVar17._8_8_,auVar17._0_8_);
        QByteArray::toLower_helper(&local_68);
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char *)0x0;
        local_98.d.size = 0;
        QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                  ((QHash<QByteArray,QByteArray> *)in_RDI,&local_68,&local_98);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
          }
        }
        bVar2 = true;
      }
    }
  } while (bVar2);
  if (!bVar9) {
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)in_RDI);
  }
LAB_002183e3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)in_RDI;
}

Assistant:

static QHash<QByteArray, QByteArray> parseHttpOptionHeader(QByteArrayView header)
{
    // The HTTP header is of the form:
    // header          = #1(directives)
    // directives      = token | value-directive
    // value-directive = token "=" (token | quoted-string)
    QHash<QByteArray, QByteArray> result;

    int pos = 0;
    while (true) {
        // skip spaces
        pos = nextNonWhitespace(header, pos);
        if (pos == header.size())
            return result;      // end of parsing

        // pos points to a non-whitespace
        int comma = header.indexOf(',', pos);
        int equal = header.indexOf('=', pos);
        if (comma == pos || equal == pos)
            // huh? Broken header.
            return result;

        // The key name is delimited by either a comma, an equal sign or the end
        // of the header, whichever comes first
        int end = comma;
        if (end == -1)
            end = header.size();
        if (equal != -1 && end > equal)
            end = equal;        // equal sign comes before comma/end
        const auto key = header.sliced(pos, end - pos).trimmed();
        pos = end + 1;

        if (uint(equal) < uint(comma)) {
            // case: token "=" (token | quoted-string)
            // skip spaces
            pos = nextNonWhitespace(header, pos);
            if (pos == header.size())
                // huh? Broken header
                return result;

            QByteArray value;
            value.reserve(header.size() - pos);
            if (header.at(pos) == '"') {
                // case: quoted-string
                // quoted-string  = ( <"> *(qdtext | quoted-pair ) <"> )
                // qdtext         = <any TEXT except <">>
                // quoted-pair    = "\" CHAR
                ++pos;
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (c == '"') {
                        // end of quoted text
                        break;
                    } else if (c == '\\') {
                        ++pos;
                        if (pos >= header.size())
                            // broken header
                            return result;
                        c = header.at(pos);
                    }

                    value += c;
                    ++pos;
                }
            } else {
                const auto isSeparator = [](char c) {
                    static const char separators[] = "()<>@,;:\\\"/[]?={}";
                    return isLWS(c) || strchr(separators, c) != nullptr;
                };

                // case: token
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (isSeparator(c))
                        break;
                    value += c;
                    ++pos;
                }
            }

            result.insert(key.toByteArray().toLower(), value);

            // find the comma now:
            comma = header.indexOf(',', pos);
            if (comma == -1)
                return result;  // end of parsing
            pos = comma + 1;
        } else {
            // case: token
            // key is already set
            result.insert(key.toByteArray().toLower(), QByteArray());
        }
    }
}